

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O1

bool __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  char cVar1;
  double dVar2;
  shared_ptr<PartialJPDPValuePair> jppv;
  long *local_38;
  shared_count asStack_30 [2];
  
  if (this->_m_solved == false) {
    (**(code **)(*(long *)&(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                           super_BGIP_IncrementalSolverInterface + 0x20))(this);
  }
  *value = 0.0;
  cVar1 = BGIPSolution::IsEmptyJPPV();
  if (cVar1 == '\0') {
    BGIPSolution::GetNextSolutionJPPV();
    dVar2 = (double)(**(code **)(*local_38 + 0x18))();
  }
  else {
    cVar1 = BGIPSolution::IsEmptyPJPDP();
    if (cVar1 != '\0') goto LAB_001172c3;
    BGIPSolution::GetNextSolutionPJPDP();
    dVar2 = (double)(**(code **)(*local_38 + 0x18))();
  }
  *value = dVar2;
  boost::detail::shared_count::~shared_count(asStack_30);
LAB_001172c3:
  asStack_30[0].pi_ = (jpol->pn).pi_;
  jpol->px = (element_type *)0x0;
  (jpol->pn).pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count(asStack_30);
  *value = 0.0;
  return false;
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"

            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }

        return(foundSolution);
    }